

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O0

void produce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                *s)

{
  long lVar1;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *pSVar2;
  long *plVar3;
  int64_t k_1;
  int64_t k;
  int64_t sequence;
  int64_t i;
  int64_t iterations;
  int64_t *in_stack_ffffffffffffffb8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *in_stack_ffffffffffffffc0;
  int64_t *in_stack_ffffffffffffffc8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *in_stack_ffffffffffffffd0;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *pSVar4;
  int64_t *local_28;
  long local_18;
  
  lVar1 = counter * RING_BUFFER_SIZE;
  for (local_18 = 0; local_18 < lVar1; local_18 = local_18 + 1) {
    pSVar2 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
              *)disruptor::
                Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                ::Claim(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    pSVar4 = pSVar2;
    if (pSVar2 < delta) {
      for (local_28 = (int64_t *)0x0; (long)local_28 <= (long)pSVar2;
          local_28 = (int64_t *)((long)local_28 + 1)) {
        in_stack_ffffffffffffffc8 = local_28;
        plVar3 = disruptor::
                 Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                 ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        *plVar3 = (long)in_stack_ffffffffffffffc8;
      }
      disruptor::
      Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
      ::Publish(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                (size_t)in_stack_ffffffffffffffc0);
    }
    else {
      for (; in_stack_ffffffffffffffd0 = pSVar4,
          (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
           *)((long)pSVar2 - delta) < in_stack_ffffffffffffffd0;
          pSVar4 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                    *)&pSVar4[-1].field_0x1bf) {
        pSVar4 = in_stack_ffffffffffffffd0;
        plVar3 = disruptor::
                 Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                 ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffb8);
        *plVar3 = (long)in_stack_ffffffffffffffd0;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffd0;
      }
      disruptor::
      Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
      ::Publish(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                (size_t)in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W, Alignment>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {
    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int64_t k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}